

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

Expression __thiscall
dynet::UnidirectionalTreeLSTMBuilder::add_input
          (UnidirectionalTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  bool bVar1;
  uint *puVar2;
  RNNBuilder *in_RDX;
  value_type *in_RDI;
  uint child;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  RNNPointer prev;
  Expression embedding;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  Expression *in_stack_ffffffffffffff80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48 [2];
  RNNPointer local_34;
  Expression local_10;
  
  local_34 = 0xffffffff;
  local_10 = RNNBuilder::add_input(in_RDX,(RNNPointer *)in_RDI,in_stack_ffffffffffffff80);
  local_34 = RNNBuilder::state((RNNBuilder *)(in_RDI + 0xd));
  local_48[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff80,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff78);
    if (!bVar1) break;
    puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(local_48);
    in_stack_ffffffffffffff80 = in_RDI + 0xd;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)(in_RDI + 0x2a),
               (ulong)*puVar2);
    local_10 = RNNBuilder::add_input(in_RDX,(RNNPointer *)in_RDI,in_stack_ffffffffffffff80);
    local_34 = RNNBuilder::state((RNNBuilder *)(in_RDI + 0xd));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_48);
  }
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)in_RDX,in_RDI);
  return local_10;
}

Assistant:

Expression UnidirectionalTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");

  RNNPointer prev = (RNNPointer)(-1);
  Expression embedding = node_builder.add_input(prev, x);
  prev = node_builder.state();

  for (unsigned child : children) {
    embedding = node_builder.add_input(prev, h[child]);
    prev = node_builder.state();
  }
  h.push_back(embedding);
  return embedding;
}